

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O2

void __thiscall Liby::PollerPoll::loop_once(PollerPoll *this,Timestamp *ts)

{
  ushort uVar1;
  pollfd *__fds;
  pointer ppVar2;
  Channel *pCVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  Timestamp now;
  _Any_data local_50;
  undefined8 local_40;
  undefined8 uStack_38;
  
  Poller::runNextLoopHandlers(&this->super_Poller);
  if (ts == (Timestamp *)0x0) {
    iVar5 = -1;
  }
  else {
    Timestamp::now();
    bVar4 = operator<(ts,&now);
    iVar5 = 0;
    if (!bVar4) {
      operator-((Liby *)local_50._M_pod_data,ts,&now);
      iVar5 = (int)((long)local_50._8_8_ / 1000) + local_50._0_4_ * 1000;
    }
  }
  __fds = (pollfd *)
          (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar5 = poll(__fds,(long)(this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)__fds >> 3,iVar5);
  uVar7 = 0;
  while ((uVar7 < (ulong)((long)(this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) && (0 < iVar5))) {
    local_50._8_8_ = 0;
    now.tv_.tv_usec = 0;
    local_40 = 0;
    uStack_38 = 0;
    now.tv_.tv_sec = (__time_t)this;
    local_50._M_unused._M_object = this;
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    ppVar2 = (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)ppVar2[uVar7].fd;
    if ((-1 < lVar6) &&
       (pCVar3 = (this->super_Poller).channels_.
                 super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6], pCVar3 != (Channel *)0x0)) {
      uVar1 = ppVar2[uVar7].revents;
      if ((uVar1 & 0x2008) == 0) {
        bVar4 = (uVar1 & 1) != 0;
        if (bVar4) {
          Channel::handleReadEvent(pCVar3);
        }
        uVar8 = (uint)bVar4;
        if (((uVar1 & 4) != 0) &&
           (pCVar3 = (this->super_Poller).channels_.
                     super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6], pCVar3 != (Channel *)0x0)) {
          uVar8 = 1;
          Channel::handleWritEvent(pCVar3);
        }
        iVar5 = iVar5 - uVar8;
      }
      else {
        Channel::handleErroEvent(pCVar3);
      }
    }
    DeferCaller::~DeferCaller((DeferCaller *)&now);
    uVar7 = uVar7 + 1;
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  return;
}

Assistant:

void PollerPoll::loop_once(Timestamp *ts) {
    runNextLoopHandlers();

    int interMs = -1;
    if (ts != nullptr) {
        Timestamp now = Timestamp::now();
        if (*ts < now) {
            interMs = 0;
        } else {
            interMs = static_cast<int>((*ts - now).toMillSec());
        }
    }

    int nready = ::poll(&pollfds_[0], pollfds_.size(), interMs);

    for (decltype(pollfds_.size()) i = 0; i < pollfds_.size() && nready > 0;
         i++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        bool flag = false;
        int fd = pollfds_[i].fd;
        int revent = pollfds_[i].revents;
        Channel *ch;

        if (fd < 0 || (ch = getChannel(fd)) == nullptr)
            continue;

        if (revent & POLLERR
#ifdef __linux__
            || revent & POLLRDHUP
#endif
            ) {
            flag = true;
            ch->handleErroEvent();
            continue;
        }

        // readEventHandler可能会将ch析构,所以简单的改了一下逻辑
        if (revent & POLLIN) {
            flag = true;
            ch->handleReadEvent();
        }

        if (revent & POLLOUT && (ch = getChannel(fd)) != nullptr) {
            flag = true;
            ch->handleWritEvent();
        }

        if (flag == true) {
            nready--;
        }
    }

    runAfterLoopHandlers();
}